

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

LayoutDirection __thiscall QTextBlock::textDirection(QTextBlock *this)

{
  char16_t *pcVar1;
  FragmentMap *this_00;
  char16_t *pcVar2;
  QTextDocumentPrivate *pQVar3;
  QArrayData *pQVar4;
  QTextDocumentPrivate *pQVar5;
  QTextFragmentData *pQVar6;
  bool bVar7;
  LayoutDirection LVar8;
  LayoutDirection k;
  uint n;
  quint32 qVar9;
  uint uVar10;
  int iVar11;
  wchar32 wVar12;
  char16_t *pcVar13;
  char16_t *pcVar14;
  long in_FS_OFFSET;
  char16_t *local_70;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blockFormat((QTextBlock *)&local_48);
  LVar8 = QTextFormat::intProperty(&local_48,0x801);
  QTextFormat::~QTextFormat(&local_48);
  if (LVar8 == LayoutDirectionAuto) {
    pQVar3 = this->p;
    LVar8 = *(uint *)&pQVar3->defaultTextOption >> 0xe & (LayoutDirectionAuto|RightToLeft);
    if (LVar8 == LayoutDirectionAuto) {
      pQVar4 = &((pQVar3->text).d.d)->super_QArrayData;
      local_70 = (pQVar3->text).d.ptr;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      k = position(this);
      pQVar3 = this->p;
      this_00 = &pQVar3->fragments;
      LVar8 = LeftToRight;
      n = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,k,0);
      pQVar5 = this->p;
      qVar9 = 0;
      if (pQVar5 != (QTextDocumentPrivate *)0x0) {
        qVar9 = 0;
        if ((ulong)(uint)this->n != 0) {
          qVar9 = (pQVar5->blocks).data.field_0.fragments[(uint)this->n].super_QFragment<3>.
                  size_array[0];
        }
      }
      uVar10 = QFragmentMapData<QTextFragmentData>::findNode
                         (&(pQVar5->fragments).data,qVar9 + k + -1,0);
      if ((pQVar3 != pQVar5) || (n != uVar10)) {
        LVar8 = k;
        if (local_70 == (char16_t *)0x0) {
          local_70 = (char16_t *)&QString::_empty;
        }
        do {
          pQVar6 = (this_00->data).field_0.fragments;
          pcVar2 = local_70 + pQVar6[n].stringPosition + pQVar6[n].super_QFragment<1>.size_array[0];
          pcVar14 = local_70 + pQVar6[n].stringPosition;
          do {
            pcVar13 = pcVar14;
            if (pcVar2 <= pcVar13) break;
            wVar12 = (wchar32)(ushort)*pcVar13;
            pcVar14 = pcVar13;
            if ((((wVar12 & 0xfc00U) == 0xd800) && (pcVar1 = pcVar13 + 1, pcVar1 < pcVar2)) &&
               (((ushort)*pcVar1 & 0xfc00) == 0xdc00)) {
              wVar12 = (uint)(ushort)*pcVar13 * 0x400 + (uint)(ushort)*pcVar1 + L'\xfca02400';
              pcVar14 = pcVar1;
            }
            iVar11 = QChar::direction(wVar12);
            if (iVar11 == 0) {
              bVar7 = false;
              LVar8 = LeftToRight;
            }
            else if ((iVar11 == 0xd) || (iVar11 == 1)) {
              LVar8 = RightToLeft;
              bVar7 = false;
            }
            else {
              pcVar14 = pcVar14 + 1;
              bVar7 = true;
            }
          } while (bVar7);
          if (pcVar13 < pcVar2) goto LAB_0053585e;
          n = QFragmentMapData<QTextFragmentData>::next(&this_00->data,n);
        } while ((pQVar3 != pQVar5) || (n != uVar10));
        LVar8 = LeftToRight;
      }
LAB_0053585e:
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return LVar8;
}

Assistant:

Qt::LayoutDirection QTextBlock::textDirection() const
{
    Qt::LayoutDirection dir = blockFormat().layoutDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    dir = p->defaultTextOption.textDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    const QString buffer = p->buffer();

    const int pos = position();
    QTextDocumentPrivate::FragmentIterator it = p->find(pos);
    QTextDocumentPrivate::FragmentIterator end = p->find(pos + length() - 1); // -1 to omit the block separator char
    for (; it != end; ++it) {
        const QTextFragmentData * const frag = it.value();
        const QChar *p = buffer.constData() + frag->stringPosition;
        const QChar * const end = p + frag->size_array[0];
        while (p < end) {
            uint ucs4 = p->unicode();
            if (QChar::isHighSurrogate(ucs4) && p + 1 < end) {
                ushort low = p[1].unicode();
                if (QChar::isLowSurrogate(low)) {
                    ucs4 = QChar::surrogateToUcs4(ucs4, low);
                    ++p;
                }
            }
            switch (QChar::direction(ucs4)) {
            case QChar::DirL:
                return Qt::LeftToRight;
            case QChar::DirR:
            case QChar::DirAL:
                return Qt::RightToLeft;
            default:
                break;
            }
            ++p;
        }
    }
    return Qt::LeftToRight;
}